

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_kslot(jit_State *J,TRef key,IRRef slot)

{
  ushort uVar1;
  uint uVar2;
  IRIns *pIVar3;
  int in_EDX;
  uint in_ESI;
  jit_State *in_RDI;
  IRRef ref;
  IRRef2 op12;
  IRIns *cir;
  IRIns *ir;
  IRRef ref_1;
  uint local_38;
  jit_State *pjVar4;
  
  pIVar3 = (in_RDI->cur).ir;
  uVar2 = in_ESI & 0xffff | in_EDX << 0x10;
  uVar1 = in_RDI->chain[0x1e];
  while (local_38 = (uint)uVar1, local_38 != 0) {
    if (pIVar3[local_38].field_1.op12 == uVar2) goto LAB_0015a323;
    uVar1 = *(ushort *)((long)pIVar3 + (ulong)local_38 * 8 + 6);
  }
  local_38 = (in_RDI->cur).nk;
  pjVar4 = in_RDI;
  if (local_38 <= in_RDI->irbotlim) {
    lj_ir_growbot(in_RDI);
  }
  local_38 = local_38 - 1;
  (in_RDI->cur).nk = local_38;
  pIVar3 = (pjVar4->cur).ir + local_38;
  (pIVar3->field_1).op12 = uVar2;
  (pIVar3->field_1).t.irt = '\x05';
  (pIVar3->field_1).o = '\x1e';
  (pIVar3->field_0).prev = pjVar4->chain[0x1e];
  pjVar4->chain[0x1e] = (IRRef1)local_38;
LAB_0015a323:
  return local_38 + 0x5000000;
}

Assistant:

TRef lj_ir_kslot(jit_State *J, TRef key, IRRef slot)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef2 op12 = IRREF2((IRRef1)key, (IRRef1)slot);
  IRRef ref;
  /* Const part is not touched by CSE/DCE, so 0-65535 is ok for IRMlit here. */
  lj_assertJ(tref_isk(key) && slot == (IRRef)(IRRef1)slot,
	     "out-of-range key/slot");
  for (ref = J->chain[IR_KSLOT]; ref; ref = cir[ref].prev)
    if (cir[ref].op12 == op12)
      goto found;
  ref = ir_nextk(J);
  ir = IR(ref);
  ir->op12 = op12;
  ir->t.irt = IRT_P32;
  ir->o = IR_KSLOT;
  ir->prev = J->chain[IR_KSLOT];
  J->chain[IR_KSLOT] = (IRRef1)ref;
found:
  return TREF(ref, IRT_P32);
}